

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

bool vkb::detail::supports_features
               (VkPhysicalDeviceFeatures *supported,VkPhysicalDeviceFeatures *requested,
               GenericFeatureChain *extension_supported,GenericFeatureChain *extension_requested)

{
  GenericFeatureChain *extension_requested_local;
  GenericFeatureChain *extension_supported_local;
  VkPhysicalDeviceFeatures *requested_local;
  VkPhysicalDeviceFeatures *supported_local;
  
  if ((requested->robustBufferAccess == 0) || (supported->robustBufferAccess != 0)) {
    if ((requested->fullDrawIndexUint32 == 0) || (supported->fullDrawIndexUint32 != 0)) {
      if ((requested->imageCubeArray == 0) || (supported->imageCubeArray != 0)) {
        if ((requested->independentBlend == 0) || (supported->independentBlend != 0)) {
          if ((requested->geometryShader == 0) || (supported->geometryShader != 0)) {
            if ((requested->tessellationShader == 0) || (supported->tessellationShader != 0)) {
              if ((requested->sampleRateShading == 0) || (supported->sampleRateShading != 0)) {
                if ((requested->dualSrcBlend == 0) || (supported->dualSrcBlend != 0)) {
                  if ((requested->logicOp == 0) || (supported->logicOp != 0)) {
                    if ((requested->multiDrawIndirect == 0) || (supported->multiDrawIndirect != 0))
                    {
                      if ((requested->drawIndirectFirstInstance == 0) ||
                         (supported->drawIndirectFirstInstance != 0)) {
                        if ((requested->depthClamp == 0) || (supported->depthClamp != 0)) {
                          if ((requested->depthBiasClamp == 0) || (supported->depthBiasClamp != 0))
                          {
                            if ((requested->fillModeNonSolid == 0) ||
                               (supported->fillModeNonSolid != 0)) {
                              if ((requested->depthBounds == 0) || (supported->depthBounds != 0)) {
                                if ((requested->wideLines == 0) || (supported->wideLines != 0)) {
                                  if ((requested->largePoints == 0) || (supported->largePoints != 0)
                                     ) {
                                    if ((requested->alphaToOne == 0) || (supported->alphaToOne != 0)
                                       ) {
                                      if ((requested->multiViewport == 0) ||
                                         (supported->multiViewport != 0)) {
                                        if ((requested->samplerAnisotropy == 0) ||
                                           (supported->samplerAnisotropy != 0)) {
                                          if ((requested->textureCompressionETC2 == 0) ||
                                             (supported->textureCompressionETC2 != 0)) {
                                            if ((requested->textureCompressionASTC_LDR == 0) ||
                                               (supported->textureCompressionASTC_LDR != 0)) {
                                              if ((requested->textureCompressionBC == 0) ||
                                                 (supported->textureCompressionBC != 0)) {
                                                if ((requested->occlusionQueryPrecise == 0) ||
                                                   (supported->occlusionQueryPrecise != 0)) {
                                                  if ((requested->pipelineStatisticsQuery == 0) ||
                                                     (supported->pipelineStatisticsQuery != 0)) {
                                                    if ((requested->vertexPipelineStoresAndAtomics
                                                         == 0) ||
                                                       (supported->vertexPipelineStoresAndAtomics !=
                                                        0)) {
                                                      if ((requested->fragmentStoresAndAtomics == 0)
                                                         || (supported->fragmentStoresAndAtomics !=
                                                             0)) {
                                                        if ((requested->
                                                             shaderTessellationAndGeometryPointSize
                                                             == 0) ||
                                                           (supported->
                                                            shaderTessellationAndGeometryPointSize
                                                            != 0)) {
                                                          if ((requested->shaderImageGatherExtended
                                                               == 0) ||
                                                             (supported->shaderImageGatherExtended
                                                              != 0)) {
                                                            if ((requested->
                                                                 shaderStorageImageExtendedFormats
                                                                 == 0) ||
                                                               (supported->
                                                                shaderStorageImageExtendedFormats !=
                                                                0)) {
                                                              if ((requested->
                                                                   shaderStorageImageMultisample ==
                                                                   0) || (supported->
                                                                                                                                                    
                                                  shaderStorageImageMultisample != 0)) {
                                                    if ((requested->
                                                         shaderStorageImageReadWithoutFormat == 0)
                                                       || (supported->
                                                           shaderStorageImageReadWithoutFormat != 0)
                                                       ) {
                                                      if ((requested->
                                                           shaderStorageImageWriteWithoutFormat == 0
                                                          ) || (supported->
                                                                shaderStorageImageWriteWithoutFormat
                                                                != 0)) {
                                                        if ((requested->
                                                             shaderUniformBufferArrayDynamicIndexing
                                                             == 0) ||
                                                           (supported->
                                                            shaderUniformBufferArrayDynamicIndexing
                                                            != 0)) {
                                                          if ((requested->
                                                                                                                              
                                                  shaderSampledImageArrayDynamicIndexing == 0) ||
                                                  (supported->shaderSampledImageArrayDynamicIndexing
                                                   != 0)) {
                                                    if ((requested->
                                                         shaderStorageBufferArrayDynamicIndexing ==
                                                         0) || (supported->
                                                                                                                                
                                                  shaderStorageBufferArrayDynamicIndexing != 0)) {
                                                    if ((requested->
                                                         shaderStorageImageArrayDynamicIndexing == 0
                                                        ) || (supported->
                                                              shaderStorageImageArrayDynamicIndexing
                                                              != 0)) {
                                                      if ((requested->shaderClipDistance == 0) ||
                                                         (supported->shaderClipDistance != 0)) {
                                                        if ((requested->shaderCullDistance == 0) ||
                                                           (supported->shaderCullDistance != 0)) {
                                                          if ((requested->shaderFloat64 == 0) ||
                                                             (supported->shaderFloat64 != 0)) {
                                                            if ((requested->shaderInt64 == 0) ||
                                                               (supported->shaderInt64 != 0)) {
                                                              if ((requested->shaderInt16 == 0) ||
                                                                 (supported->shaderInt16 != 0)) {
                                                                if ((requested->
                                                                     shaderResourceResidency == 0)
                                                                   || (supported->
                                                                       shaderResourceResidency != 0)
                                                                   ) {
                                                                  if ((requested->
                                                                       shaderResourceMinLod == 0) ||
                                                                     (supported->
                                                                      shaderResourceMinLod != 0)) {
                                                                    if ((requested->sparseBinding ==
                                                                         0) || (supported->
                                                                                sparseBinding != 0))
                                                                    {
                                                                      if ((requested->
                                                                           sparseResidencyBuffer ==
                                                                           0) || (supported->
                                                                                                                                                                    
                                                  sparseResidencyBuffer != 0)) {
                                                    if ((requested->sparseResidencyImage2D == 0) ||
                                                       (supported->sparseResidencyImage2D != 0)) {
                                                      if ((requested->sparseResidencyImage3D == 0)
                                                         || (supported->sparseResidencyImage3D != 0)
                                                         ) {
                                                        if ((requested->sparseResidency2Samples == 0
                                                            ) || (supported->sparseResidency2Samples
                                                                  != 0)) {
                                                          if ((requested->sparseResidency4Samples ==
                                                               0) || (supported->
                                                                      sparseResidency4Samples != 0))
                                                          {
                                                            if ((requested->sparseResidency8Samples
                                                                 == 0) ||
                                                               (supported->sparseResidency8Samples
                                                                != 0)) {
                                                              if ((requested->
                                                                   sparseResidency16Samples == 0) ||
                                                                 (supported->
                                                                  sparseResidency16Samples != 0)) {
                                                                if ((requested->
                                                                     sparseResidencyAliased == 0) ||
                                                                   (supported->
                                                                    sparseResidencyAliased != 0)) {
                                                                  if ((requested->
                                                                       variableMultisampleRate == 0)
                                                                     || (supported->
                                                                         variableMultisampleRate !=
                                                                         0)) {
                                                                    if ((requested->inheritedQueries
                                                                         == 0) ||
                                                                       (supported->inheritedQueries
                                                                        != 0)) {
                                                                      supported_local._7_1_ =
                                                                           GenericFeatureChain::
                                                                           match_all(
                                                  extension_supported,extension_requested);
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    supported_local._7_1_ = false;
                                                  }
                                                }
                                                else {
                                                  supported_local._7_1_ = false;
                                                }
                                              }
                                              else {
                                                supported_local._7_1_ = false;
                                              }
                                            }
                                            else {
                                              supported_local._7_1_ = false;
                                            }
                                          }
                                          else {
                                            supported_local._7_1_ = false;
                                          }
                                        }
                                        else {
                                          supported_local._7_1_ = false;
                                        }
                                      }
                                      else {
                                        supported_local._7_1_ = false;
                                      }
                                    }
                                    else {
                                      supported_local._7_1_ = false;
                                    }
                                  }
                                  else {
                                    supported_local._7_1_ = false;
                                  }
                                }
                                else {
                                  supported_local._7_1_ = false;
                                }
                              }
                              else {
                                supported_local._7_1_ = false;
                              }
                            }
                            else {
                              supported_local._7_1_ = false;
                            }
                          }
                          else {
                            supported_local._7_1_ = false;
                          }
                        }
                        else {
                          supported_local._7_1_ = false;
                        }
                      }
                      else {
                        supported_local._7_1_ = false;
                      }
                    }
                    else {
                      supported_local._7_1_ = false;
                    }
                  }
                  else {
                    supported_local._7_1_ = false;
                  }
                }
                else {
                  supported_local._7_1_ = false;
                }
              }
              else {
                supported_local._7_1_ = false;
              }
            }
            else {
              supported_local._7_1_ = false;
            }
          }
          else {
            supported_local._7_1_ = false;
          }
        }
        else {
          supported_local._7_1_ = false;
        }
      }
      else {
        supported_local._7_1_ = false;
      }
    }
    else {
      supported_local._7_1_ = false;
    }
  }
  else {
    supported_local._7_1_ = false;
  }
  return supported_local._7_1_;
}

Assistant:

bool supports_features(const VkPhysicalDeviceFeatures& supported,
					   const VkPhysicalDeviceFeatures& requested,
					   const GenericFeatureChain& extension_supported,
					   const GenericFeatureChain& extension_requested) {

	if (requested.robustBufferAccess && !supported.robustBufferAccess) return false;
	if (requested.fullDrawIndexUint32 && !supported.fullDrawIndexUint32) return false;
	if (requested.imageCubeArray && !supported.imageCubeArray) return false;
	if (requested.independentBlend && !supported.independentBlend) return false;
	if (requested.geometryShader && !supported.geometryShader) return false;
	if (requested.tessellationShader && !supported.tessellationShader) return false;
	if (requested.sampleRateShading && !supported.sampleRateShading) return false;
	if (requested.dualSrcBlend && !supported.dualSrcBlend) return false;
	if (requested.logicOp && !supported.logicOp) return false;
	if (requested.multiDrawIndirect && !supported.multiDrawIndirect) return false;
	if (requested.drawIndirectFirstInstance && !supported.drawIndirectFirstInstance) return false;
	if (requested.depthClamp && !supported.depthClamp) return false;
	if (requested.depthBiasClamp && !supported.depthBiasClamp) return false;
	if (requested.fillModeNonSolid && !supported.fillModeNonSolid) return false;
	if (requested.depthBounds && !supported.depthBounds) return false;
	if (requested.wideLines && !supported.wideLines) return false;
	if (requested.largePoints && !supported.largePoints) return false;
	if (requested.alphaToOne && !supported.alphaToOne) return false;
	if (requested.multiViewport && !supported.multiViewport) return false;
	if (requested.samplerAnisotropy && !supported.samplerAnisotropy) return false;
	if (requested.textureCompressionETC2 && !supported.textureCompressionETC2) return false;
	if (requested.textureCompressionASTC_LDR && !supported.textureCompressionASTC_LDR) return false;
	if (requested.textureCompressionBC && !supported.textureCompressionBC) return false;
	if (requested.occlusionQueryPrecise && !supported.occlusionQueryPrecise) return false;
	if (requested.pipelineStatisticsQuery && !supported.pipelineStatisticsQuery) return false;
	if (requested.vertexPipelineStoresAndAtomics && !supported.vertexPipelineStoresAndAtomics) return false;
	if (requested.fragmentStoresAndAtomics && !supported.fragmentStoresAndAtomics) return false;
	if (requested.shaderTessellationAndGeometryPointSize && !supported.shaderTessellationAndGeometryPointSize) return false;
	if (requested.shaderImageGatherExtended && !supported.shaderImageGatherExtended) return false;
	if (requested.shaderStorageImageExtendedFormats && !supported.shaderStorageImageExtendedFormats) return false;
	if (requested.shaderStorageImageMultisample && !supported.shaderStorageImageMultisample) return false;
	if (requested.shaderStorageImageReadWithoutFormat && !supported.shaderStorageImageReadWithoutFormat) return false;
	if (requested.shaderStorageImageWriteWithoutFormat && !supported.shaderStorageImageWriteWithoutFormat) return false;
	if (requested.shaderUniformBufferArrayDynamicIndexing && !supported.shaderUniformBufferArrayDynamicIndexing) return false;
	if (requested.shaderSampledImageArrayDynamicIndexing && !supported.shaderSampledImageArrayDynamicIndexing) return false;
	if (requested.shaderStorageBufferArrayDynamicIndexing && !supported.shaderStorageBufferArrayDynamicIndexing) return false;
	if (requested.shaderStorageImageArrayDynamicIndexing && !supported.shaderStorageImageArrayDynamicIndexing) return false;
	if (requested.shaderClipDistance && !supported.shaderClipDistance) return false;
	if (requested.shaderCullDistance && !supported.shaderCullDistance) return false;
	if (requested.shaderFloat64 && !supported.shaderFloat64) return false;
	if (requested.shaderInt64 && !supported.shaderInt64) return false;
	if (requested.shaderInt16 && !supported.shaderInt16) return false;
	if (requested.shaderResourceResidency && !supported.shaderResourceResidency) return false;
	if (requested.shaderResourceMinLod && !supported.shaderResourceMinLod) return false;
	if (requested.sparseBinding && !supported.sparseBinding) return false;
	if (requested.sparseResidencyBuffer && !supported.sparseResidencyBuffer) return false;
	if (requested.sparseResidencyImage2D && !supported.sparseResidencyImage2D) return false;
	if (requested.sparseResidencyImage3D && !supported.sparseResidencyImage3D) return false;
	if (requested.sparseResidency2Samples && !supported.sparseResidency2Samples) return false;
	if (requested.sparseResidency4Samples && !supported.sparseResidency4Samples) return false;
	if (requested.sparseResidency8Samples && !supported.sparseResidency8Samples) return false;
	if (requested.sparseResidency16Samples && !supported.sparseResidency16Samples) return false;
	if (requested.sparseResidencyAliased && !supported.sparseResidencyAliased) return false;
	if (requested.variableMultisampleRate && !supported.variableMultisampleRate) return false;
	if (requested.inheritedQueries && !supported.inheritedQueries) return false;

	return extension_supported.match_all(extension_requested);
}